

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CMU462::Vertex::getAxes
          (Vertex *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  double dVar1;
  pointer pVVar2;
  _List_node_base *p_Var3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector3D local_30;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  normal(&local_30,this);
  pVVar2 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].z = local_30.z;
  pVVar2[2].x = local_30.x;
  pVVar2[2].y = local_30.y;
  p_Var3 = (this->_halfedge)._M_node[1]._M_prev[2]._M_prev;
  dVar5 = (double)p_Var3[1]._M_prev - (this->position).x;
  dVar7 = (double)p_Var3[2]._M_next - (this->position).y;
  dVar4 = (double)p_Var3[2]._M_prev - (this->position).z;
  pVVar2 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = pVVar2[2].y;
  dVar1 = pVVar2[2].z;
  dVar8 = dVar4 * dVar1 + dVar5 * pVVar2[2].x + dVar7 * dVar6;
  dVar5 = dVar5 - pVVar2[2].x * dVar8;
  pVVar2->x = dVar5;
  dVar7 = dVar7 - dVar6 * dVar8;
  pVVar2->y = dVar7;
  dVar4 = dVar4 - dVar8 * dVar1;
  pVVar2->z = dVar4;
  dVar6 = dVar4 * dVar4 + dVar5 * dVar5 + dVar7 * dVar7;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = 1.0 / dVar6;
  pVVar2->x = pVVar2->x * dVar6;
  pVVar2->y = pVVar2->y * dVar6;
  pVVar2->z = dVar6 * pVVar2->z;
  pVVar2 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = pVVar2[2].y;
  dVar1 = pVVar2->z;
  dVar4 = pVVar2[2].z;
  dVar5 = pVVar2->x;
  dVar7 = pVVar2->y;
  dVar8 = pVVar2[2].x;
  pVVar2[1].x = dVar6 * dVar1 - dVar7 * dVar4;
  pVVar2[1].y = dVar4 * dVar5 - dVar1 * dVar8;
  pVVar2[1].z = dVar8 * dVar7 - dVar5 * dVar6;
  return;
}

Assistant:

void Vertex::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the Z direction to the normal direction
    axes[2] = normal();

    // Use the first outgoing edge to pick an arbitrary X
    // direction, projecting out any component of the Z
    // direction chosen above
    Vector3D p0 = position;
    Vector3D p1 = halfedge()->twin()->vertex()->position;
    axes[0] = p1 - p0;
    axes[0] -= dot( axes[0], axes[2] ) * axes[2];
    axes[0].normalize();

    // For the third axis, just take the cross product of
    // the first two, being careful to pick the order of the
    // cross product to satisfy the right-hand rule (i.e.,
    // so in the end we get X x Y = Z).
    axes[1] = cross( axes[2], axes[0] );
  }